

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadClass.cpp
# Opt level: O1

void __thiscall sznet::Thread::start(Thread *this)

{
  ThreadData *this_00;
  sz_thread_t sVar1;
  _Any_data local_40;
  _Manager_type local_30;
  
  if (this->m_started == true) {
    __assert_fail("!m_started",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/thread/ThreadClass.cpp"
                  ,0x98,"void sznet::Thread::start()");
  }
  this->m_started = true;
  this_00 = (ThreadData *)operator_new(0x50);
  std::function<void_()>::function((function<void_()> *)&local_40,&this->m_func);
  detail::ThreadData::ThreadData
            (this_00,(ThreadFunc *)&local_40,&this->m_name,&this->m_tid,&this->m_latch);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  sVar1 = sz_thread_create(detail::startThread,this_00);
  this->m_pthreadId = sVar1;
  CountDownLatch::wait(&this->m_latch,this_00);
  if (0 < this->m_tid) {
    return;
  }
  __assert_fail("m_tid > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/thread/ThreadClass.cpp"
                ,0xab,"void sznet::Thread::start()");
}

Assistant:

void Thread::start()
{
	assert(!m_started);
	m_started = true;
	// FIXME: move(m_func)
	detail::ThreadData* data = new detail::ThreadData(m_func, m_name, &m_tid, &m_latch);
	m_pthreadId = sz_thread_create(&detail::startThread, data);
#ifdef SZ_OS_WINDOWS
	if (reinterpret_cast<size_t>(m_pthreadId) < 0)
#else
	if (m_pthreadId < 0)
#endif
	{
		m_started = false;
		delete data;
		data = nullptr;
		LOG_SYSFATAL << "Failed in thread create";
	}
	else
	{
		m_latch.wait();
		assert(m_tid > 0);
	}
}